

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  char *pcVar2;
  char *__end;
  ulong uVar3;
  long in_FS_OFFSET;
  byte local_159;
  char *dash;
  char *p;
  string *full_name;
  string *test_name_local;
  string *test_case_name_local;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [8];
  string negative;
  string positive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&positive.field_2 + 8);
  std::operator+(__return_storage_ptr__,test_case_name,".");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator+(&local_30,__return_storage_ptr__,pcVar2);
  std::__cxx11::string::~string((string *)(positive.field_2._M_local_buf + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __end = strchr(pcVar2,0x2d);
  std::__cxx11::string::string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_90);
  if (__end == (char *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)(negative.field_2._M_local_buf + 8),pcVar2);
    std::__cxx11::string::operator=(local_90,"");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (local_b0,pcVar2,__end,(allocator<char> *)((long)&test_case_name_local + 7));
    std::__cxx11::string::operator=((string *)(negative.field_2._M_local_buf + 8),local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&test_case_name_local + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_d0,__end + 1,(allocator<char> *)((long)&test_case_name_local + 6));
    std::__cxx11::string::operator=(local_90,local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&test_case_name_local + 6));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)(negative.field_2._M_local_buf + 8),"*");
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = MatchesFilter(&local_30,pcVar2);
  local_159 = 0;
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = MatchesFilter(&local_30,pcVar2);
    local_159 = bVar1 ^ 0xff;
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(negative.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (bool)(local_159 & 1);
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}